

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOD.h
# Opt level: O0

void __thiscall
dg::DOD::computeDOD(DOD *this,ColoredAp *CAp,CDNode *p,ResultT *CD,ResultT *revCD,bool asTernary)

{
  CDNode *r1_00;
  ResultT *in_RSI;
  tuple<dg::CDNode_*&,_dg::CDNode_*&> *in_RDI;
  byte in_R9B;
  pair<dg::CDNode_*,_dg::CDNode_*> pVar1;
  anon_class_8_1_ba1cbf32 isred;
  anon_class_8_1_ba1cbf32 isblue;
  unsigned_long bid;
  CDNode *r2;
  CDNode *r1;
  CDNode *b3;
  CDNode *b2;
  CDNode *b1;
  undefined8 in_stack_ffffffffffffff08;
  CDGraph *in_stack_ffffffffffffff10;
  pair<dg::CDNode_*,_dg::CDNode_*> *in_stack_ffffffffffffff18;
  undefined1 in_stack_ffffffffffffff28 [16];
  CDNode *in_stack_ffffffffffffff38;
  DOD *in_stack_ffffffffffffff40;
  ResultT *CD_00;
  CDNode *in_stack_ffffffffffffff88;
  ColoredAp *in_stack_ffffffffffffff90;
  CDNode *r2_00;
  
  r2_00 = (CDNode *)0x0;
  ADT::
  SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::MapImpl<unsigned_long,_unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>
  ::begin((SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::MapImpl<unsigned_long,_unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>
           *)in_stack_ffffffffffffff10);
  r1_00 = (CDNode *)
          ADT::
          SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::MapImpl<unsigned_long,_unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>
          ::const_iterator::operator*((const_iterator *)in_stack_ffffffffffffff10);
  CDGraph::getNode(in_stack_ffffffffffffff10,(uint)((ulong)in_stack_ffffffffffffff08 >> 0x20));
  CD_00 = in_RSI;
  pVar1 = find<dg::DOD::computeDOD(dg::DOD::ColoredAp&,dg::CDNode*,std::map<dg::CDNode*,std::set<dg::CDNode*,std::less<dg::CDNode*>,std::allocator<dg::CDNode*>>,std::less<dg::CDNode*>,std::allocator<std::pair<dg::CDNode*const,std::set<dg::CDNode*,std::less<dg::CDNode*>,std::allocator<dg::CDNode*>>>>>&,std::map<dg::CDNode*,std::set<dg::CDNode*,std::less<dg::CDNode*>,std::allocator<dg::CDNode*>>,std::less<dg::CDNode*>,std::allocator<std::pair<dg::CDNode*const,std::set<dg::CDNode*,std::less<dg::CDNode*>,std::allocator<dg::CDNode*>>>>>&,bool)::_lambda(dg::CDNode*)_1_,dg::DOD::computeDOD(dg::DOD::ColoredAp&,dg::CDNode*,std::map<dg::CDNode*,std::set<dg::CDNode*,std::less<dg::CDNode*>,std::allocator<dg::CDNode*>>,std::less<dg::CDNode*>,std::allocator<std::pair<dg::CDNode*const,std::set<dg::CDNode*,std::less<dg::CDNode*>,std::allocator<dg::CDNode*>>>>>&,std::map<dg::CDNode*,std::set<dg::CDNode*,std::less<dg::CDNode*>,std::allocator<dg::CDNode*>>,std::less<dg::CDNode*>,std::allocator<std::pair<dg::CDNode*const,std::set<dg::CDNode*,std::less<dg::CDNode*>,std::allocator<dg::CDNode*>>>>>&,bool)::_lambda(dg::CDNode*)_2_>
                    (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
                     in_stack_ffffffffffffff28._8_8_,in_stack_ffffffffffffff28._0_8_,
                     (anon_class_8_1_ba1cbf32 *)in_RDI);
  std::tie<dg::CDNode*,dg::CDNode*>
            (&in_stack_ffffffffffffff18->first,(CDNode **)in_stack_ffffffffffffff10);
  std::tuple<dg::CDNode*&,dg::CDNode*&>::operator=(in_RDI,in_stack_ffffffffffffff18);
  find<dg::DOD::computeDOD(dg::DOD::ColoredAp&,dg::CDNode*,std::map<dg::CDNode*,std::set<dg::CDNode*,std::less<dg::CDNode*>,std::allocator<dg::CDNode*>>,std::less<dg::CDNode*>,std::allocator<std::pair<dg::CDNode*const,std::set<dg::CDNode*,std::less<dg::CDNode*>,std::allocator<dg::CDNode*>>>>>&,std::map<dg::CDNode*,std::set<dg::CDNode*,std::less<dg::CDNode*>,std::allocator<dg::CDNode*>>,std::less<dg::CDNode*>,std::allocator<std::pair<dg::CDNode*const,std::set<dg::CDNode*,std::less<dg::CDNode*>,std::allocator<dg::CDNode*>>>>>&,bool)::_lambda(dg::CDNode*)_2_,dg::DOD::computeDOD(dg::DOD::ColoredAp&,dg::CDNode*,std::map<dg::CDNode*,std::set<dg::CDNode*,std::less<dg::CDNode*>,std::allocator<dg::CDNode*>>,std::less<dg::CDNode*>,std::allocator<std::pair<dg::CDNode*const,std::set<dg::CDNode*,std::less<dg::CDNode*>,std::allocator<dg::CDNode*>>>>>&,std::map<dg::CDNode*,std::set<dg::CDNode*,std::less<dg::CDNode*>,std::allocator<dg::CDNode*>>,std::less<dg::CDNode*>,std::allocator<std::pair<dg::CDNode*const,std::set<dg::CDNode*,std::less<dg::CDNode*>,std::allocator<dg::CDNode*>>>>>&,bool)::_lambda(dg::CDNode*)_1_>
            (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff28._8_8_,
             in_stack_ffffffffffffff28._0_8_,(anon_class_8_1_ba1cbf32 *)in_RDI);
  std::tie<dg::CDNode*,dg::CDNode*>
            (&in_stack_ffffffffffffff18->first,(CDNode **)in_stack_ffffffffffffff10);
  std::tuple<dg::CDNode*&,dg::CDNode*&>::operator=(in_RDI,in_stack_ffffffffffffff18);
  if ((in_R9B & 1) == 0) {
    constructBinaryRelation
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,CD_00,in_RSI,pVar1.second,
               pVar1.first,r1_00,r2_00);
  }
  else {
    constructTernaryRelation
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,CD_00,in_RSI,pVar1.second,
               pVar1.first,r1_00,r2_00);
  }
  return;
}

Assistant:

void computeDOD(ColoredAp &CAp, CDNode *p, ResultT &CD, ResultT &revCD,
                    bool asTernary = false) {
        assert(checkAp(CAp.Ap)); // sanity check

        CDNode *b1 = nullptr, *b2 = nullptr, *b3 = nullptr;
        CDNode *r1 = nullptr, *r2 = nullptr;

        // get some blue node to have a starting point
        auto bid = *(CAp.blues.begin());
        // DBG(tmp, "Blue node with id " << bid);
        b1 = CAp.Ap.getNode(bid);
        assert(b1 && "The blue node is not on Ap");
        // DBG(tmp, "Starting from blue: " << b1->getID());
        assert(CAp.isBlue(b1));

        auto isblue = [&](CDNode *x) -> bool { return CAp.isBlue(x); };
        auto isred = [&](CDNode *x) -> bool { return CAp.isRed(x); };

        std::tie(b2, r1) = find(b1, b1, isblue, isred);
        std::tie(r2, b3) = find(r1, b1, isred, isblue);
        if (b3 != nullptr) {
            if (find(b3, b1, isred, isred).first != nullptr) {
                // there is another red, no DOD
                return;
            }
        } else {
            b3 = b1;
        }

        assert(b1);
        assert(b2);
        assert(b3);
        assert(r1);
        assert(r2);

        if (asTernary) {
            constructTernaryRelation(CAp, p, CD, revCD, b2, b3, r1, r2);
        } else { // break into binary relation
            constructBinaryRelation(CAp, p, CD, revCD, b2, b3, r1, r2);
        }
    }